

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_member_reference_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t base,SPIRType *type,
          uint32_t index,bool ptr_chain_is_resolved)

{
  bool bVar1;
  uint32_t type_id;
  SPIRType *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool local_b4;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  string local_98;
  string local_68;
  bool local_45;
  uint32_t local_44;
  ID IStack_40;
  bool is_buffer_variable;
  bool local_3a;
  bool local_39;
  bool is_block;
  SPIRVariable *pSStack_38;
  bool declared_as_pointer;
  SPIRVariable *var;
  bool ptr_chain_is_resolved_local;
  SPIRType *pSStack_28;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *pCStack_18;
  uint32_t base_local;
  CompilerMSL *this_local;
  
  var._3_1_ = ptr_chain_is_resolved;
  var._4_4_ = index;
  pSStack_28 = type;
  type_local._4_4_ = base;
  pCStack_18 = this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  pSStack_38 = Compiler::maybe_get_backing_variable((Compiler *)this,base);
  local_39 = false;
  if (pSStack_38 != (SPIRVariable *)0x0) {
    IStack_40.id = (pSStack_28->super_IVariant).self.id;
    bVar1 = Compiler::has_decoration((Compiler *)this,IStack_40,Block);
    local_b1 = true;
    if (!bVar1) {
      local_44 = (pSStack_28->super_IVariant).self.id;
      local_b1 = Compiler::has_decoration((Compiler *)this,(ID)local_44,BufferBlock);
    }
    local_3a = local_b1;
    local_b2 = false;
    if (local_b1 != false) {
      local_b3 = true;
      if (pSStack_38->storage != StorageClassUniform) {
        local_b3 = pSStack_38->storage == StorageBuffer;
      }
      local_b2 = local_b3;
    }
    local_45 = local_b2;
    local_b4 = false;
    if (local_b2 != false) {
      type_id = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_38->super_IVariant).field_0xc);
      type_00 = Compiler::get_pointee_type((Compiler *)this,type_id);
      local_b4 = Compiler::is_array((Compiler *)this,type_00);
    }
    local_39 = local_b4;
  }
  if ((local_39 != false) ||
     (((var._3_1_ & 1) == 0 &&
      (bVar1 = CompilerGLSL::should_dereference(&this->super_CompilerGLSL,type_local._4_4_), bVar1))
     )) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var._4_4_;
    CompilerGLSL::to_member_name_abi_cxx11_
              (&local_68,&this->super_CompilerGLSL,pSStack_28,var._4_4_);
    join<char_const(&)[3],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)0x676e40,(char (*) [3])&local_68,pbVar2);
    ::std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var._4_4_;
    CompilerGLSL::to_member_name_abi_cxx11_
              (&local_98,&this->super_CompilerGLSL,pSStack_28,var._4_4_);
    join<char_const(&)[2],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)0x62c2d7,(char (*) [2])&local_98,pbVar2);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_member_reference(uint32_t base, const SPIRType &type, uint32_t index, bool ptr_chain_is_resolved)
{
	auto *var = maybe_get_backing_variable(base);
	// If this is a buffer array, we have to dereference the buffer pointers.
	// Otherwise, if this is a pointer expression, dereference it.

	bool declared_as_pointer = false;

	if (var)
	{
		// Only allow -> dereference for block types. This is so we get expressions like
		// buffer[i]->first_member.second_member, rather than buffer[i]->first->second.
		const bool is_block =
		    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

		bool is_buffer_variable =
		    is_block && (var->storage == StorageClassUniform || var->storage == StorageClassStorageBuffer);
		declared_as_pointer = is_buffer_variable && is_array(get_pointee_type(var->basetype));
	}

	if (declared_as_pointer || (!ptr_chain_is_resolved && should_dereference(base)))
		return join("->", to_member_name(type, index));
	else
		return join(".", to_member_name(type, index));
}